

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

_Bool roaring_bitmap_intersect(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  uint16_t x;
  ushort x_00;
  int iVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  undefined1 uVar5;
  uint uVar6;
  uint pos;
  byte bVar7;
  byte bVar8;
  int pos_00;
  ulong uVar9;
  ulong uVar10;
  
  iVar1 = (x1->high_low_container).size;
  iVar2 = (x2->high_low_container).size;
  uVar9 = 0;
  pos = 0;
  do {
    uVar10 = uVar9 & 0xffff;
    while( true ) {
      pos_00 = (int)uVar9;
      bVar3 = pos_00 < iVar2;
      bVar4 = (int)pos < iVar1;
      if (!bVar4 || !bVar3) {
        return bVar4 && bVar3;
      }
      uVar6 = pos & 0xffff;
      x = (x1->high_low_container).keys[uVar6];
      x_00 = (x2->high_low_container).keys[uVar10];
      if (x == x_00) {
        bVar7 = (x1->high_low_container).typecodes[uVar6];
        if (bVar7 == 4) {
          bVar7 = *(byte *)((long)(x1->high_low_container).containers[uVar6] + 8);
        }
        bVar8 = (x2->high_low_container).typecodes[uVar10];
        if (bVar8 == 4) {
          bVar8 = *(byte *)((long)(x2->high_low_container).containers[uVar10] + 8);
        }
        uVar5 = (*(code *)(&DAT_00127a2c +
                          *(int *)(&DAT_00127a2c + (ulong)(((uint)bVar8 + (uint)bVar7 * 4) - 5) * 4)
                          ))();
        return (_Bool)uVar5;
      }
      if (x_00 <= x) break;
      pos = ra_advance_until(&x1->high_low_container,x_00,pos);
    }
    uVar6 = ra_advance_until(&x2->high_low_container,x,pos_00);
    uVar9 = (ulong)uVar6;
  } while( true );
}

Assistant:

bool roaring_bitmap_intersect(const roaring_bitmap_t *x1,
                              const roaring_bitmap_t *x2) {
    const int length1 = x1->high_low_container.size,
              length2 = x2->high_low_container.size;
    uint64_t answer = 0;
    int pos1 = 0, pos2 = 0;

    while (pos1 < length1 && pos2 < length2) {
        const uint16_t s1 =
            ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
        const uint16_t s2 =
            ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);

        if (s1 == s2) {
            uint8_t type1, type2;
            container_t *c1 = ra_get_container_at_index(&x1->high_low_container,
                                                        (uint16_t)pos1, &type1);
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        (uint16_t)pos2, &type2);
            if (container_intersect(c1, type1, c2, type2)) return true;
            ++pos1;
            ++pos2;
        } else if (s1 < s2) {  // s1 < s2
            pos1 = ra_advance_until(&x1->high_low_container, s2, pos1);
        } else {  // s1 > s2
            pos2 = ra_advance_until(&x2->high_low_container, s1, pos2);
        }
    }
    return answer != 0;
}